

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

void print_last_session_error(char *function)

{
  uint uVar1;
  undefined8 uStack_18;
  int rc;
  char *message;
  char *function_local;
  
  message = function;
  if (connected_session == (LIBSSH2_SESSION *)0x0) {
    fprintf(_stderr,"No session\n");
  }
  else {
    uVar1 = libssh2_session_last_error(connected_session,&stack0xffffffffffffffe8,0,0);
    fprintf(_stderr,"%s failed (%d): %s\n",message,(ulong)uVar1,uStack_18);
  }
  return;
}

Assistant:

void print_last_session_error(const char *function)
{
    if(connected_session) {
        char *message;
        int rc =
            libssh2_session_last_error(connected_session, &message, NULL, 0);
        fprintf(stderr, "%s failed (%d): %s\n", function, rc, message);
    }
    else {
        fprintf(stderr, "No session\n");
    }
}